

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                   (string *__return_storage_ptr__,EnumValueDescriptor *descriptor,
                   FileDescriptor *file)

{
  bool bVar1;
  char cVar2;
  FileDescriptor *pFVar3;
  string *psVar4;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  AlphaNum *this;
  string message;
  char *local_120;
  size_t local_118;
  char local_110 [16];
  AlphaNum local_100;
  string_view local_d0 [3];
  undefined1 local_a0 [32];
  AlphaNum local_80;
  AlphaNum local_50;
  
  bVar1 = (descriptor->options_->field_0)._impl_.deprecated_;
  cVar2 = bVar1;
  if (file != (FileDescriptor *)0x0 && bVar1 == false) {
    cVar2 = (file->options_->field_0)._impl_.deprecated_;
  }
  if (cVar2 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_d0);
  }
  else {
    local_120 = local_110;
    local_118 = 0;
    local_110[0] = '\0';
    pFVar3 = descriptor->type_->file_;
    if (file != (FileDescriptor *)0x0 && bVar1 == false) {
      psVar4 = pFVar3->name_;
      local_d0[0]._M_str = (psVar4->_M_dataplus)._M_p;
      local_d0[0]._M_len = psVar4->_M_string_length;
      local_80.piece_ = absl::lts_20250127::NullSafeStringView(" is deprecated.");
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)&local_100,(lts_20250127 *)local_d0,&local_80,&local_80);
      this = &local_100;
    }
    else {
      local_d0[0]._M_str = descriptor->all_names_[1]._M_dataplus._M_p;
      local_d0[0]._M_len = descriptor->all_names_[1]._M_string_length;
      local_80.piece_ = absl::lts_20250127::NullSafeStringView(" is deprecated (see ");
      psVar4 = pFVar3->name_;
      local_100.piece_._M_str = (psVar4->_M_dataplus)._M_p;
      local_100.piece_._M_len = psVar4->_M_string_length;
      local_50.piece_ = absl::lts_20250127::NullSafeStringView(").");
      in_R8 = &local_50;
      absl::lts_20250127::StrCat_abi_cxx11_
                ((string *)local_a0,(lts_20250127 *)local_d0,&local_80,&local_100,in_R8,in_R9);
      this = (AlphaNum *)local_a0;
    }
    std::__cxx11::string::operator=((string *)&local_120,(string *)this);
    std::__cxx11::string::~string((string *)this);
    local_d0[0] = absl::lts_20250127::NullSafeStringView("GPB_DEPRECATED_MSG(\"");
    local_80.piece_._M_str = local_120;
    local_80.piece_._M_len = local_118;
    local_100.piece_ = absl::lts_20250127::NullSafeStringView("\")");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)local_d0,&local_80,&local_100,in_R8);
    std::__cxx11::string::~string((string *)&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetOptionalDeprecatedAttribute(
    const TDescriptor* descriptor, const FileDescriptor* file = nullptr) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  bool isFileLevelDeprecation = false;
  if (!isDeprecated && file) {
    isFileLevelDeprecation = file->options().deprecated();
    isDeprecated = isFileLevelDeprecation;
  }
  if (isDeprecated) {
    std::string message;
    const FileDescriptor* sourceFile = descriptor->file();
    if (isFileLevelDeprecation) {
      message = absl::StrCat(sourceFile->name(), " is deprecated.");
    } else {
      message = absl::StrCat(descriptor->full_name(), " is deprecated (see ",
                             sourceFile->name(), ").");
    }

    return absl::StrCat("GPB_DEPRECATED_MSG(\"", message, "\")");
  } else {
    return "";
  }
}